

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ADIOS.cpp
# Opt level: O3

void __thiscall adios2::core::ADIOS::ADIOS(ADIOS *this,string *hostLanguage)

{
  pointer pcVar1;
  Comm CStack_68;
  string local_60;
  string local_40;
  
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"");
  helper::CommDummy();
  pcVar1 = (hostLanguage->_M_dataplus)._M_p;
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_60,pcVar1,pcVar1 + hostLanguage->_M_string_length);
  ADIOS(this,&local_40,&CStack_68,&local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p);
  }
  helper::Comm::~Comm(&CStack_68);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  return;
}

Assistant:

ADIOS::ADIOS(const std::string hostLanguage) : ADIOS("", helper::CommDummy(), hostLanguage) {}